

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_typed_array_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue obj;
  JSValue v;
  int iVar1;
  long in_RSI;
  JSTypedArray *ta;
  JSObject *p;
  JSRuntime *in_stack_ffffffffffffffb8;
  list_head *plVar2;
  JSValueUnion in_stack_ffffffffffffffc0;
  JSRuntime *rt_00;
  JSValueUnion JVar3;
  int64_t iVar4;
  
  plVar2 = *(list_head **)(in_RSI + 0x30);
  if (plVar2 != (list_head *)0x0) {
    JVar3 = (JSValueUnion)plVar2[1].next;
    iVar4 = -1;
    obj.tag = (int64_t)JVar3.ptr;
    obj.u.float64 = in_stack_ffffffffffffffc0.float64;
    iVar1 = JS_IsLiveObject(in_stack_ffffffffffffffb8,obj);
    if (iVar1 != 0) {
      list_del(plVar2);
    }
    plVar2 = plVar2[1].next;
    rt_00 = (JSRuntime *)0xffffffffffffffff;
    v.tag = iVar4;
    v.u.ptr = JVar3.ptr;
    JS_FreeValueRT((JSRuntime *)0xffffffffffffffff,v);
    js_free_rt(rt_00,plVar2);
  }
  return;
}

Assistant:

static void js_typed_array_finalizer(JSRuntime *rt, JSValue val)
{
    JSObject *p = JS_VALUE_GET_OBJ(val);
    JSTypedArray *ta = p->u.typed_array;
    if (ta) {
        /* during the GC the finalizers are called in an arbitrary
           order so the ArrayBuffer finalizer may have been called */
        if (JS_IsLiveObject(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer))) {
            list_del(&ta->link);
        }
        JS_FreeValueRT(rt, JS_MKPTR(JS_TAG_OBJECT, ta->buffer));
        js_free_rt(rt, ta);
    }
}